

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  pointer piVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>_>
  *this_00;
  int i;
  ulong uVar2;
  
  this_00 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                      ((RepeatedPtrFieldBase *)(this->annotation_proto_ + 0x10));
  for (uVar2 = 0;
      piVar1 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,
      uVar2 < (ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar2 = uVar2 + 1) {
    RepeatedField<int>::Add((RepeatedField<int> *)(this_00 + 0x18),piVar1[uVar2]);
  }
  this_00[0x10] =
       (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>_>
        )((byte)this_00[0x10] | 1);
  google::protobuf::internal::ArenaStringPtr::Set<>((string *)(this_00 + 0x30),(Arena *)file_path);
  *(int *)(this_00 + 0x38) = (int)begin_offset;
  *(int *)(this_00 + 0x3c) = (int)end_offset;
  this_00[0x10] =
       (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>_>
        )((byte)this_00[0x10] | 6);
  if (((ulong)semantic.
              super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
              _M_payload.
              super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> >>
       0x20 & 1) == 0) {
    return;
  }
  GeneratedCodeInfo_Annotation::set_semantic
            (this_00,semantic.
                     super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                     ._M_payload);
  return;
}

Assistant:

void AddAnnotation(size_t begin_offset, size_t end_offset,
                     const std::string& file_path, const std::vector<int>& path,
                     absl::optional<Semantic> semantic) override {
    auto* annotation = annotation_proto_->add_annotation();
    for (int i = 0; i < path.size(); ++i) {
      annotation->add_path(path[i]);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);

    if (semantic.has_value()) {
      SetSemantic(annotation, *semantic, Rank1{});
    }
  }